

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O1

string * cmStrCat<char_const(&)[37],char_const*>
                   (string *__return_storage_ptr__,char (*a) [37],char **b)

{
  char *__s;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_50;
  size_t local_38;
  char *local_30;
  undefined8 local_28;
  
  local_50.first._M_len = strlen(*a);
  local_50.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  __s = *b;
  local_50.first._M_str = *a;
  local_38 = strlen(__s);
  local_28 = 0;
  views._M_len = 2;
  views._M_array = &local_50;
  local_30 = __s;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}